

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

void __thiscall DL::Data::Data(Data *this,string_t *key,DataGroup *grp)

{
  DataGroup *grp_local;
  string_t *key_local;
  Data *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  this->mType = DT_Group;
  DataGroup::DataGroup(&this->mGroup,grp);
  std::__cxx11::string::string((string *)&this->mString);
  return;
}

Assistant:

Data::Data(const string_t& key, const DataGroup& grp)
	: mKey(key)
	, mType(DT_Group)
	, mGroup(grp)
{
}